

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueInfo.cpp
# Opt level: O1

ValueInfo * __thiscall ValueInfo::Copy(ValueInfo *this,JitArenaAllocator *allocator)

{
  ValueType *this_00;
  bool bVar1;
  ValueInfo *pVVar2;
  IntBoundedValueInfo *pIVar3;
  JsTypeValueInfo *pJVar4;
  
  this_00 = &this->super_ValueType;
  bVar1 = ValueType::IsInt(this_00);
  if ((bVar1) && (this->structureKind == IntConstant)) {
    AsIntConstant(this);
    pVVar2 = (ValueInfo *)new<Memory::JitArenaAllocator>(0x20,allocator,0x3f1274);
    (pVVar2->super_ValueType).field_0 = (this->super_ValueType).field_0;
    pVVar2->_vptr_ValueInfo = (_func_int **)&PTR_AddVtable_014ea2e8;
    *(undefined4 *)((long)&pVVar2->symStore + 4) = *(undefined4 *)((long)&this->symStore + 4);
    *(undefined8 *)&pVVar2->structureKind = *(undefined8 *)&this->structureKind;
    pVVar2->_vptr_ValueInfo = (_func_int **)&PTR_AddVtable_014ea3a8;
    *(undefined4 *)&pVVar2[1]._vptr_ValueInfo = *(undefined4 *)&this[1]._vptr_ValueInfo;
    pVVar2->_vptr_ValueInfo = (_func_int **)&PTR_AddVtable_014ea390;
  }
  else {
    bVar1 = ValueType::IsInt(this_00);
    if ((bVar1) && (this->structureKind == IntRange)) {
      AsIntRange(this);
      pVVar2 = (ValueInfo *)new<Memory::JitArenaAllocator>(0x28,allocator,0x3f1274);
      (pVVar2->super_ValueType).field_0 = (this->super_ValueType).field_0;
      pVVar2->_vptr_ValueInfo = (_func_int **)&PTR_AddVtable_014ea2e8;
      *(undefined4 *)((long)&pVVar2->symStore + 4) = *(undefined4 *)((long)&this->symStore + 4);
      *(undefined8 *)&pVVar2->structureKind = *(undefined8 *)&this->structureKind;
      pVVar2[1]._vptr_ValueInfo = this[1]._vptr_ValueInfo;
      pVVar2->_vptr_ValueInfo = (_func_int **)&PTR_AddVtable_014ea408;
      *(undefined1 *)&pVVar2[1].super_ValueType.field_0 =
           *(undefined1 *)&this[1].super_ValueType.field_0;
    }
    else {
      bVar1 = IsIntBounded(this);
      if (bVar1) {
        AsIntBounded(this);
        pIVar3 = IntBoundedValueInfo::Copy((IntBoundedValueInfo *)this,allocator);
        return &pIVar3->super_ValueInfo;
      }
      bVar1 = ValueType::IsFloat(this_00);
      if ((!bVar1) || (this->structureKind != FloatConstant)) {
        bVar1 = IsJsType(this);
        if (bVar1) {
          AsJsType(this);
          pJVar4 = JsTypeValueInfo::Copy((JsTypeValueInfo *)this,allocator);
          return &pJVar4->super_ValueInfo;
        }
        bVar1 = ValueType::IsAnyOptimizedArray(this_00);
        if ((bVar1) && (this->structureKind == Array)) {
          AsArrayValueInfo(this);
          pVVar2 = ArrayValueInfo::Copy((ArrayValueInfo *)this,allocator,true,true,true);
          return pVVar2;
        }
        pVVar2 = CopyWithGenericStructureKind(this,allocator);
        return pVVar2;
      }
      AsFloatConstant(this);
      pVVar2 = (ValueInfo *)new<Memory::JitArenaAllocator>(0x20,allocator,0x3f1274);
      (pVVar2->super_ValueType).field_0 = (this->super_ValueType).field_0;
      pVVar2->_vptr_ValueInfo = (_func_int **)&PTR_AddVtable_014ea2e8;
      *(undefined4 *)((long)&pVVar2->symStore + 4) = *(undefined4 *)((long)&this->symStore + 4);
      *(undefined8 *)&pVVar2->structureKind = *(undefined8 *)&this->structureKind;
      pVVar2->_vptr_ValueInfo = (_func_int **)&PTR_AddVtable_014ea468;
      pVVar2[1]._vptr_ValueInfo = this[1]._vptr_ValueInfo;
    }
  }
  return pVVar2;
}

Assistant:

ValueInfo *
ValueInfo::Copy(JitArenaAllocator * allocator)
{
    if (IsIntConstant())
    {
        return AsIntConstant()->Copy(allocator);
    }
    if (IsIntRange())
    {
        return AsIntRange()->Copy(allocator);
    }
    if (IsIntBounded())
    {
        return AsIntBounded()->Copy(allocator);
    }
    if (IsFloatConstant())
    {
        return AsFloatConstant()->Copy(allocator);
    }
    if (IsJsType())
    {
        return AsJsType()->Copy(allocator);
    }
    if (IsArrayValueInfo())
    {
        return AsArrayValueInfo()->Copy(allocator);
    }
    return CopyWithGenericStructureKind(allocator);
}